

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::_::
concat<kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>,kj::StringPtr&,kj::CappedArray<char,17ul>>
          (String *__return_storage_ptr__,_ *this,
          Delimited<kj::ArrayPtr<const_unsigned_char>_> *params,StringPtr *params_1,
          CappedArray<char,_17UL> *params_2)

{
  size_t size;
  size_type extraout_RDX;
  char *target;
  initializer_list<unsigned_long> nums;
  size_t local_38;
  long local_30;
  char *local_28;
  
  local_38 = Delimited<kj::ArrayPtr<const_unsigned_char>_>::size
                       ((Delimited<kj::ArrayPtr<const_unsigned_char>_> *)this);
  local_30 = (params->array).size_ - 1;
  local_28 = (params_1->content).ptr;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x3;
  size = sum((_ *)&local_38,nums);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::ArrayPtr<unsigned_char_const>,kj::StringPtr&,kj::CappedArray<char,17ul>>
            (target,(Delimited<kj::ArrayPtr<const_unsigned_char>_> *)this,(StringPtr *)params,
             (CappedArray<char,_17UL> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}